

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
spirv_cross::Compiler::InterfaceVariableAccessHandler::handle
          (InterfaceVariableAccessHandler *this,Op opcode,uint32_t *args,uint32_t length)

{
  unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
  *puVar1;
  bool bVar2;
  SPIRExtension *pSVar3;
  pair<std::__detail::_Node_iterator<spirv_cross::TypedID<(spirv_cross::Types)2>,_true,_true>,_bool>
  pVar4;
  TypedID<(spirv_cross::Types)2> local_114;
  SPIRVariable *local_110;
  SPIRVariable *var_5;
  undefined1 local_100;
  TypedID<(spirv_cross::Types)2> local_f4;
  SPIRVariable *local_f0;
  SPIRVariable *var_4;
  AMDShaderExplicitVertexParameter op;
  uint32_t extension_set;
  undefined1 local_d8;
  TypedID<(spirv_cross::Types)2> local_cc;
  _Node_iterator_base<spirv_cross::TypedID<(spirv_cross::Types)2>,_true> local_c8;
  undefined1 local_c0;
  TypedID<(spirv_cross::Types)2> local_b4;
  SPIRVariable *local_b0;
  SPIRVariable *var_3;
  undefined1 local_a0;
  TypedID<(spirv_cross::Types)2> local_94;
  SPIRVariable *local_90;
  SPIRVariable *var_2;
  uint32_t i_2;
  uint32_t count_2;
  undefined1 local_78;
  TypedID<(spirv_cross::Types)2> local_6c;
  SPIRVariable *local_68;
  SPIRVariable *var_1;
  uint32_t i_1;
  uint32_t count_1;
  undefined1 local_50;
  TypedID<(spirv_cross::Types)2> local_44;
  SPIRVariable *local_40;
  SPIRVariable *var;
  uint32_t i;
  uint32_t count;
  uint32_t variable;
  uint32_t length_local;
  uint32_t *args_local;
  InterfaceVariableAccessHandler *pIStack_18;
  Op opcode_local;
  InterfaceVariableAccessHandler *this_local;
  
  i = 0;
  count = length;
  _variable = args;
  args_local._4_4_ = opcode;
  pIStack_18 = this;
  switch(opcode) {
  case OpExtInst:
    if (length < 5) {
      return false;
    }
    var_4._4_4_ = args[2];
    pSVar3 = get<spirv_cross::SPIRExtension>(this->compiler,var_4._4_4_);
    if ((((*(int *)&(pSVar3->super_IVariant).field_0xc == 4) &&
         (var_4._0_4_ = _variable[3], (uint32_t)var_4 == 1)) &&
        (local_f0 = maybe_get<spirv_cross::SPIRVariable>(this->compiler,_variable[4]),
        local_f0 != (SPIRVariable *)0x0)) &&
       (bVar2 = storage_class_is_interface(local_f0->storage), bVar2)) {
      puVar1 = this->variables;
      TypedID<(spirv_cross::Types)2>::TypedID(&local_f4,_variable[4]);
      pVar4 = ::std::
              unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
              ::insert(puVar1,&local_f4);
      var_5 = (SPIRVariable *)
              pVar4.first.
              super__Node_iterator_base<spirv_cross::TypedID<(spirv_cross::Types)2>,_true>._M_cur;
      local_100 = pVar4.second;
    }
    break;
  default:
    break;
  case OpFunctionCall:
    if (length < 3) {
      return false;
    }
    var._4_4_ = length - 3;
    _variable = args + 3;
    for (var._0_4_ = 0; (uint)var < var._4_4_; var._0_4_ = (uint)var + 1) {
      local_40 = maybe_get<spirv_cross::SPIRVariable>(this->compiler,_variable[(uint)var]);
      if ((local_40 != (SPIRVariable *)0x0) &&
         (bVar2 = storage_class_is_interface(local_40->storage), bVar2)) {
        puVar1 = this->variables;
        TypedID<(spirv_cross::Types)2>::TypedID(&local_44,_variable[(uint)var]);
        pVar4 = ::std::
                unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
                ::insert(puVar1,&local_44);
        _i_1 = (__node_type *)
               pVar4.first.
               super__Node_iterator_base<spirv_cross::TypedID<(spirv_cross::Types)2>,_true>._M_cur;
        local_50 = pVar4.second;
      }
    }
    break;
  case OpImageTexelPointer:
  case OpLoad:
  case OpAccessChain:
  case OpInBoundsAccessChain:
  case OpPtrAccessChain:
  case OpArrayLength:
  case OpCopyObject:
  case OpAtomicLoad:
  case OpAtomicExchange:
  case OpAtomicCompareExchange:
  case OpAtomicCompareExchangeWeak:
  case OpAtomicIIncrement:
  case OpAtomicIDecrement:
  case OpAtomicIAdd:
  case OpAtomicISub:
  case OpAtomicSMin:
  case OpAtomicUMin:
  case OpAtomicSMax:
  case OpAtomicUMax:
  case OpAtomicAnd:
  case OpAtomicOr:
  case OpAtomicXor:
    if (length < 3) {
      return false;
    }
    i = args[2];
    break;
  case OpStore:
  case OpAtomicStore:
    if (length == 0) {
      return false;
    }
    i = *args;
    break;
  case OpCopyMemory:
    if (length < 2) {
      return false;
    }
    local_b0 = maybe_get<spirv_cross::SPIRVariable>(this->compiler,*args);
    if ((local_b0 != (SPIRVariable *)0x0) &&
       (bVar2 = storage_class_is_interface(local_b0->storage), bVar2)) {
      puVar1 = this->variables;
      TypedID<(spirv_cross::Types)2>::TypedID(&local_b4,*_variable);
      pVar4 = ::std::
              unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
              ::insert(puVar1,&local_b4);
      local_c8._M_cur =
           (__node_type *)
           pVar4.first.super__Node_iterator_base<spirv_cross::TypedID<(spirv_cross::Types)2>,_true>.
           _M_cur;
      local_c0 = pVar4.second;
    }
    local_b0 = maybe_get<spirv_cross::SPIRVariable>(this->compiler,_variable[1]);
    if ((local_b0 != (SPIRVariable *)0x0) &&
       (bVar2 = storage_class_is_interface(local_b0->storage), bVar2)) {
      puVar1 = this->variables;
      TypedID<(spirv_cross::Types)2>::TypedID(&local_cc,_variable[1]);
      pVar4 = ::std::
              unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
              ::insert(puVar1,&local_cc);
      _op = (__node_type *)
            pVar4.first.super__Node_iterator_base<spirv_cross::TypedID<(spirv_cross::Types)2>,_true>
            ._M_cur;
      local_d8 = pVar4.second;
    }
    break;
  case OpSelect:
    if (length < 5) {
      return false;
    }
    var_1._4_4_ = length - 3;
    _variable = args + 3;
    for (var_1._0_4_ = 0; (uint)var_1 < var_1._4_4_; var_1._0_4_ = (uint)var_1 + 1) {
      local_68 = maybe_get<spirv_cross::SPIRVariable>(this->compiler,_variable[(uint)var_1]);
      if ((local_68 != (SPIRVariable *)0x0) &&
         (bVar2 = storage_class_is_interface(local_68->storage), bVar2)) {
        puVar1 = this->variables;
        TypedID<(spirv_cross::Types)2>::TypedID(&local_6c,_variable[(uint)var_1]);
        pVar4 = ::std::
                unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
                ::insert(puVar1,&local_6c);
        _i_2 = (__node_type *)
               pVar4.first.
               super__Node_iterator_base<spirv_cross::TypedID<(spirv_cross::Types)2>,_true>._M_cur;
        local_78 = pVar4.second;
      }
    }
    break;
  case OpPhi:
    if (length < 2) {
      return false;
    }
    var_2._4_4_ = length - 2;
    _variable = args + 2;
    for (var_2._0_4_ = 0; (uint)var_2 < var_2._4_4_; var_2._0_4_ = (uint)var_2 + 2) {
      local_90 = maybe_get<spirv_cross::SPIRVariable>(this->compiler,_variable[(uint)var_2]);
      if ((local_90 != (SPIRVariable *)0x0) &&
         (bVar2 = storage_class_is_interface(local_90->storage), bVar2)) {
        puVar1 = this->variables;
        TypedID<(spirv_cross::Types)2>::TypedID(&local_94,_variable[(uint)var_2]);
        pVar4 = ::std::
                unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
                ::insert(puVar1,&local_94);
        var_3 = (SPIRVariable *)
                pVar4.first.
                super__Node_iterator_base<spirv_cross::TypedID<(spirv_cross::Types)2>,_true>._M_cur;
        local_a0 = pVar4.second;
      }
    }
  }
  if (((i != 0) &&
      (local_110 = maybe_get<spirv_cross::SPIRVariable>(this->compiler,i),
      local_110 != (SPIRVariable *)0x0)) &&
     (bVar2 = storage_class_is_interface(local_110->storage), bVar2)) {
    puVar1 = this->variables;
    TypedID<(spirv_cross::Types)2>::TypedID(&local_114,i);
    ::std::
    unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
    ::insert(puVar1,&local_114);
  }
  return true;
}

Assistant:

bool Compiler::InterfaceVariableAccessHandler::handle(Op opcode, const uint32_t *args, uint32_t length)
{
	uint32_t variable = 0;
	switch (opcode)
	{
	// Need this first, otherwise, GCC complains about unhandled switch statements.
	default:
		break;

	case OpFunctionCall:
	{
		// Invalid SPIR-V.
		if (length < 3)
			return false;

		uint32_t count = length - 3;
		args += 3;
		for (uint32_t i = 0; i < count; i++)
		{
			auto *var = compiler.maybe_get<SPIRVariable>(args[i]);
			if (var && storage_class_is_interface(var->storage))
				variables.insert(args[i]);
		}
		break;
	}

	case OpSelect:
	{
		// Invalid SPIR-V.
		if (length < 5)
			return false;

		uint32_t count = length - 3;
		args += 3;
		for (uint32_t i = 0; i < count; i++)
		{
			auto *var = compiler.maybe_get<SPIRVariable>(args[i]);
			if (var && storage_class_is_interface(var->storage))
				variables.insert(args[i]);
		}
		break;
	}

	case OpPhi:
	{
		// Invalid SPIR-V.
		if (length < 2)
			return false;

		uint32_t count = length - 2;
		args += 2;
		for (uint32_t i = 0; i < count; i += 2)
		{
			auto *var = compiler.maybe_get<SPIRVariable>(args[i]);
			if (var && storage_class_is_interface(var->storage))
				variables.insert(args[i]);
		}
		break;
	}

	case OpAtomicStore:
	case OpStore:
		// Invalid SPIR-V.
		if (length < 1)
			return false;
		variable = args[0];
		break;

	case OpCopyMemory:
	{
		if (length < 2)
			return false;

		auto *var = compiler.maybe_get<SPIRVariable>(args[0]);
		if (var && storage_class_is_interface(var->storage))
			variables.insert(args[0]);

		var = compiler.maybe_get<SPIRVariable>(args[1]);
		if (var && storage_class_is_interface(var->storage))
			variables.insert(args[1]);
		break;
	}

	case OpExtInst:
	{
		if (length < 5)
			return false;
		uint32_t extension_set = args[2];
		if (compiler.get<SPIRExtension>(extension_set).ext == SPIRExtension::SPV_AMD_shader_explicit_vertex_parameter)
		{
			enum AMDShaderExplicitVertexParameter
			{
				InterpolateAtVertexAMD = 1
			};

			auto op = static_cast<AMDShaderExplicitVertexParameter>(args[3]);

			switch (op)
			{
			case InterpolateAtVertexAMD:
			{
				auto *var = compiler.maybe_get<SPIRVariable>(args[4]);
				if (var && storage_class_is_interface(var->storage))
					variables.insert(args[4]);
				break;
			}

			default:
				break;
			}
		}
		break;
	}

	case OpAccessChain:
	case OpInBoundsAccessChain:
	case OpPtrAccessChain:
	case OpLoad:
	case OpCopyObject:
	case OpImageTexelPointer:
	case OpAtomicLoad:
	case OpAtomicExchange:
	case OpAtomicCompareExchange:
	case OpAtomicCompareExchangeWeak:
	case OpAtomicIIncrement:
	case OpAtomicIDecrement:
	case OpAtomicIAdd:
	case OpAtomicISub:
	case OpAtomicSMin:
	case OpAtomicUMin:
	case OpAtomicSMax:
	case OpAtomicUMax:
	case OpAtomicAnd:
	case OpAtomicOr:
	case OpAtomicXor:
	case OpArrayLength:
		// Invalid SPIR-V.
		if (length < 3)
			return false;
		variable = args[2];
		break;
	}

	if (variable)
	{
		auto *var = compiler.maybe_get<SPIRVariable>(variable);
		if (var && storage_class_is_interface(var->storage))
			variables.insert(variable);
	}
	return true;
}